

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

bool google::protobuf::compiler::ApplyMapping
               (string_view filename,string_view old_prefix,string_view new_prefix,string *result)

{
  bool bVar1;
  compiler *pcVar2;
  compiler *this;
  string_view path;
  string_view path_00;
  string_view prefix;
  allocator<char> local_79;
  string_view after_prefix;
  string local_68 [32];
  string_view new_prefix_local;
  string_view filename_local;
  
  new_prefix_local._M_str = new_prefix._M_str;
  new_prefix_local._M_len = new_prefix._M_len;
  path._M_len = filename._M_str;
  this = (compiler *)filename._M_len;
  pcVar2 = (compiler *)old_prefix._M_len;
  filename_local._M_len = (size_t)this;
  filename_local._M_str = path._M_len;
  if (pcVar2 == (compiler *)0x0) {
    path._M_str = (char *)0x0;
    bVar1 = ContainsParentReference(this,path);
    if ((!bVar1) &&
       (prefix._M_str = "/", prefix._M_len = 1,
       bVar1 = absl::lts_20250127::StartsWith(filename,prefix), !bVar1)) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_68,&new_prefix_local,(allocator<char> *)&after_prefix);
      std::__cxx11::string::operator=((string *)result,local_68);
      std::__cxx11::string::~string(local_68);
      if (result->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)result);
      }
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_68,&filename_local,(allocator<char> *)&after_prefix);
      std::__cxx11::string::append((string *)result);
LAB_00bde0ed:
      std::__cxx11::string::~string(local_68);
      return true;
    }
  }
  else {
    bVar1 = absl::lts_20250127::StartsWith(filename,old_prefix);
    if (bVar1) {
      if (this == pcVar2) {
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_68,&new_prefix_local,(allocator<char> *)&after_prefix);
        std::__cxx11::string::operator=((string *)result,local_68);
        goto LAB_00bde0ed;
      }
      if (path._M_len[(long)pcVar2] == '/') {
        pcVar2 = (compiler *)(ulong)((int)old_prefix._M_len + 1);
      }
      else if ((path._M_len + -1)[(long)pcVar2] != '/') {
        return false;
      }
      if ((int)pcVar2 != -1) {
        after_prefix = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 (&filename_local,(long)(int)pcVar2,0xffffffffffffffff);
        path_00._M_str = after_prefix._M_str;
        path_00._M_len = (size_t)path_00._M_str;
        bVar1 = ContainsParentReference((compiler *)after_prefix._M_len,path_00);
        if (!bVar1) {
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_68,&new_prefix_local,&local_79);
          std::__cxx11::string::operator=((string *)result,local_68);
          std::__cxx11::string::~string(local_68);
          if (result->_M_string_length != 0) {
            std::__cxx11::string::push_back((char)result);
          }
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_68,&after_prefix,&local_79);
          std::__cxx11::string::append((string *)result);
          std::__cxx11::string::~string(local_68);
        }
        return !bVar1;
      }
    }
  }
  return false;
}

Assistant:

static bool ApplyMapping(absl::string_view filename,
                         absl::string_view old_prefix,
                         absl::string_view new_prefix, std::string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (absl::StartsWith(filename, "/") || IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(std::string(new_prefix));
    if (!result->empty()) result->push_back('/');
    result->append(std::string(filename));
    return true;
  } else if (absl::StartsWith(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = std::string(new_prefix);
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        absl::string_view after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(std::string(new_prefix));
        if (!result->empty()) result->push_back('/');
        result->append(std::string(after_prefix));
        return true;
      }
    }
  }

  return false;
}